

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O2

void __thiscall RString::Capitalize(RString *this)

{
  char cVar1;
  byte bVar2;
  int i;
  long lVar3;
  
  PrepForMod(this);
  cVar1 = *this->myString;
  if ((byte)(cVar1 + 0x9fU) < 0x1a) {
    *this->myString = cVar1 + -0x20;
  }
  lVar3 = 1;
  while( true ) {
    bVar2 = this->myString[lVar3];
    if (bVar2 == 0) break;
    if ((byte)(bVar2 + 0xbf) < 0x1a) {
      this->myString[lVar3] = bVar2 | 0x20;
    }
    lVar3 = lVar3 + 1;
  }
  return;
}

Assistant:

void RString::Capitalize(void)
{
	PrepForMod();
	if(*myString >= 'a' && *myString <= 'z')
		*myString += 'A' - 'a';
	for(int i = 1; *(myString + i) != '\0'; i++)
		if(*(myString + i) >= 'A' && *(myString + i) <= 'Z')
			*(myString + i) += 'a' - 'A';
}